

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestP4.cxx
# Opt level: O3

void __thiscall
cmCTestP4::ChangesParser::ChangesParser(ChangesParser *this,cmCTestP4 *p4,char *prefix)

{
  cmProcessTools::LineParser::LineParser(&this->super_LineParser,'\n',true);
  (this->super_LineParser).super_OutputParser._vptr_OutputParser =
       (_func_int **)&PTR__ChangesParser_0069adf8;
  (this->RegexIdentify).regmatch.startp[0] = (char *)0x0;
  (this->RegexIdentify).regmatch.endp[0] = (char *)0x0;
  (this->RegexIdentify).regmatch.searchstring = (char *)0x0;
  (this->RegexIdentify).program = (char *)0x0;
  this->P4 = p4;
  cmProcessTools::LineParser::SetLog
            (&this->super_LineParser,(p4->super_cmCTestGlobalVC).super_cmCTestVC.Log,prefix);
  cmsys::RegularExpression::compile(&this->RegexIdentify,"^Change ([0-9]+) on");
  return;
}

Assistant:

ChangesParser(cmCTestP4* p4, const char* prefix)
    : P4(p4)
  {
    this->SetLog(&P4->Log, prefix);
    this->RegexIdentify.compile("^Change ([0-9]+) on");
  }